

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcInventory::~IfcInventory(IfcInventory *this,void **vtt)

{
  void **vtt_local;
  IfcInventory *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0x19];
  *(void **)&this->field_0x88 = vtt[0x1a];
  *(void **)&this->field_0x98 = vtt[0x1b];
  *(void **)&this->field_0xd0 = vtt[0x1c];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0x1d];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>::~ListOf
            (&this->ResponsiblePersons);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr(&this->Jurisdiction);
  std::__cxx11::string::~string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>).field_0x10);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>,vtt + 0x17);
  IfcGroup::~IfcGroup((IfcGroup *)this,vtt + 1);
  return;
}

Assistant:

IfcInventory() : Object("IfcInventory") {}